

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int windowExprGtZero(Parse *pParse,Expr *pExpr)

{
  long lVar1;
  sqlite3 *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  int ret;
  sqlite3_value *pVal;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd8;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  sqlite3ValueFromExpr
            (in_RSI,(Expr *)(ulong)in_stack_ffffffffffffffd8,(u8)((ulong)*in_RDI >> 0x38),
             (u8)((ulong)*in_RDI >> 0x30),
             (sqlite3_value **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  sqlite3ValueFree((sqlite3_value *)0x20dde5);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int windowExprGtZero(Parse *pParse, Expr *pExpr){
  int ret = 0;
  sqlite3 *db = pParse->db;
  sqlite3_value *pVal = 0;
  sqlite3ValueFromExpr(db, pExpr, db->enc, SQLITE_AFF_NUMERIC, &pVal);
  if( pVal && sqlite3_value_int(pVal)>0 ){
    ret = 1;
  }
  sqlite3ValueFree(pVal);
  return ret;
}